

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O0

FT_UInt32 ps_unicode_value(char *glyph_name)

{
  byte bVar1;
  unsigned_long uVar2;
  bool bVar3;
  char *local_58;
  char *p_2;
  uint local_48;
  FT_UInt32 value_2;
  uint d_1;
  char c_1;
  char *p_1;
  FT_UInt32 value_1;
  FT_Int count_1;
  uint d;
  char c;
  char *p;
  FT_UInt32 value;
  FT_Int count;
  char *glyph_name_local;
  
  if (((*glyph_name == 'u') && (glyph_name[1] == 'n')) && (glyph_name[2] == 'i')) {
    p._0_4_ = 0;
    _d = (byte *)(glyph_name + 3);
    for (p._4_4_ = 4; 0 < p._4_4_; p._4_4_ = p._4_4_ + -1) {
      bVar1 = *_d;
      value_1 = bVar1 - 0x30;
      if (9 < value_1) {
        if (bVar1 - 0x41 < 6) {
          value_1 = bVar1 - 0x37;
        }
        else {
          value_1 = 0x10;
        }
      }
      if (0xf < value_1) break;
      p._0_4_ = (uint)p * 0x10 + value_1;
      _d = _d + 1;
    }
    if (p._4_4_ == 0) {
      if (*_d == 0) {
        return (uint)p;
      }
      if (*_d == 0x2e) {
        return (uint)p | 0x80000000;
      }
    }
  }
  if (*glyph_name == 'u') {
    p_1._0_4_ = 0;
    _d_1 = (byte *)(glyph_name + 1);
    for (p_1._4_4_ = 6; 0 < p_1._4_4_; p_1._4_4_ = p_1._4_4_ + -1) {
      bVar1 = *_d_1;
      local_48 = bVar1 - 0x30;
      if (9 < local_48) {
        if (bVar1 - 0x41 < 6) {
          local_48 = bVar1 - 0x37;
        }
        else {
          local_48 = 0x10;
        }
      }
      if (0xf < local_48) break;
      p_1._0_4_ = (uint)p_1 * 0x10 + local_48;
      _d_1 = _d_1 + 1;
    }
    if (p_1._4_4_ < 3) {
      if (*_d_1 == 0) {
        return (uint)p_1;
      }
      if (*_d_1 == 0x2e) {
        return (uint)p_1 | 0x80000000;
      }
    }
  }
  p_2._4_4_ = 0;
  local_58 = glyph_name;
  while( true ) {
    bVar3 = false;
    if (*local_58 != '\0') {
      bVar3 = *local_58 != '.';
    }
    if (!bVar3) break;
    local_58 = local_58 + 1;
  }
  if (glyph_name < local_58) {
    uVar2 = ft_get_adobe_glyph_index(glyph_name,local_58);
    p_2._4_4_ = (uint)uVar2;
    if (*local_58 == '.') {
      p_2._4_4_ = p_2._4_4_ | 0x80000000;
    }
  }
  return p_2._4_4_;
}

Assistant:

static FT_UInt32
  ps_unicode_value( const char*  glyph_name )
  {
    /* If the name begins with `uni', then the glyph name may be a */
    /* hard-coded unicode character code.                          */
    if ( glyph_name[0] == 'u' &&
         glyph_name[1] == 'n' &&
         glyph_name[2] == 'i' )
    {
      /* determine whether the next four characters following are */
      /* hexadecimal.                                             */

      /* XXX: Add code to deal with ligatures, i.e. glyph names like */
      /*      `uniXXXXYYYYZZZZ'...                                   */

      FT_Int       count;
      FT_UInt32    value = 0;
      const char*  p     = glyph_name + 3;


      for ( count = 4; count > 0; count--, p++ )
      {
        char          c = *p;
        unsigned int  d;


        d = (unsigned char)c - '0';
        if ( d >= 10 )
        {
          d = (unsigned char)c - 'A';
          if ( d >= 6 )
            d = 16;
          else
            d += 10;
        }

        /* Exit if a non-uppercase hexadecimal character was found   */
        /* -- this also catches character codes below `0' since such */
        /* negative numbers cast to `unsigned int' are far too big.  */
        if ( d >= 16 )
          break;

        value = ( value << 4 ) + d;
      }

      /* there must be exactly four hex digits */
      if ( count == 0 )
      {
        if ( *p == '\0' )
          return value;
        if ( *p == '.' )
          return (FT_UInt32)( value | VARIANT_BIT );
      }
    }

    /* If the name begins with `u', followed by four to six uppercase */
    /* hexadecimal digits, it is a hard-coded unicode character code. */
    if ( glyph_name[0] == 'u' )
    {
      FT_Int       count;
      FT_UInt32    value = 0;
      const char*  p     = glyph_name + 1;


      for ( count = 6; count > 0; count--, p++ )
      {
        char          c = *p;
        unsigned int  d;


        d = (unsigned char)c - '0';
        if ( d >= 10 )
        {
          d = (unsigned char)c - 'A';
          if ( d >= 6 )
            d = 16;
          else
            d += 10;
        }

        if ( d >= 16 )
          break;

        value = ( value << 4 ) + d;
      }

      if ( count <= 2 )
      {
        if ( *p == '\0' )
          return value;
        if ( *p == '.' )
          return (FT_UInt32)( value | VARIANT_BIT );
      }
    }

    /* Look for a non-initial dot in the glyph name in order to */
    /* find variants like `A.swash', `e.final', etc.            */
    {
      FT_UInt32    value = 0;
      const char*  p     = glyph_name;


      for ( ; *p && *p != '.'; p++ )
        ;

      /* now look up the glyph in the Adobe Glyph List;      */
      /* `.notdef', `.null' and the empty name are short cut */
      if ( p > glyph_name )
      {
        value = (FT_UInt32)ft_get_adobe_glyph_index( glyph_name, p );

        if ( *p == '.' )
          value |= (FT_UInt32)VARIANT_BIT;
      }

      return value;
    }
  }